

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSortByPType.cpp
# Opt level: O2

void __thiscall
SortByPTypeProcessTest_SortByPTypeStep_Test::TestBody
          (SortByPTypeProcessTest_SortByPTypeStep_Test *this)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  SortByPTypeProcess *pSVar4;
  aiMesh *rhs;
  uint (*pauVar5) [4];
  uint uVar6;
  uint f;
  ulong uVar7;
  char *pcVar8;
  char *in_R9;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  AssertHelper AStack_a8;
  AssertionResult gtest_ar_;
  AssertHelper local_90;
  AssertionResult gtest_ar;
  ScenePreprocessor s;
  
  s.scene = (this->super_SortByPTypeProcessTest).mScene;
  Assimp::ScenePreprocessor::ProcessScene(&s);
  for (lVar10 = 0; lVar10 != 0x28; lVar10 = lVar10 + 4) {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"result[m]","mScene->mMeshes[m]->mPrimitiveTypes",
               (uint *)((long)::result + lVar10),
               *(uint **)((long)((this->super_SortByPTypeProcessTest).mScene)->mMeshes + lVar10 * 2)
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar8 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                 ,0xb3,pcVar8);
      testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  pSVar4 = (this->super_SortByPTypeProcessTest).mProcess1;
  (*(pSVar4->super_BaseProcess)._vptr_BaseProcess[5])
            (pSVar4,(this->super_SortByPTypeProcessTest).mScene);
  lVar10 = 0;
  pauVar5 = ::num;
  uVar6 = 0;
LAB_0038f7f3:
  if (lVar10 == 10) {
    return;
  }
  lVar9 = 0;
  do {
    lVar11 = 0;
    while( true ) {
      lVar1 = lVar9 + lVar11;
      if (lVar1 == 4) {
        lVar10 = lVar10 + 1;
        pauVar5 = pauVar5 + 1;
        goto LAB_0038f7f3;
      }
      uVar3 = (*pauVar5)[lVar9 + lVar11];
      if (uVar3 != 0) break;
      lVar11 = lVar11 + 1;
    }
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar12 = uVar6 < ((this->super_SortByPTypeProcessTest).mScene)->mNumMeshes;
    gtest_ar_.success_ = bVar12;
    if (!bVar12) {
      testing::Message::Message((Message *)&AStack_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"real < mScene->mNumMeshes","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                 ,0xbb,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&AStack_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&AStack_a8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    rhs = ((this->super_SortByPTypeProcessTest).mScene)->mMeshes[uVar6];
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = rhs != (aiMesh *)0x0;
    if (rhs == (aiMesh *)0x0) {
      testing::Message::Message((Message *)&AStack_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"NULL != mesh",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                 ,0xbf,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&AStack_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&AStack_a8);
    }
    lVar2 = lVar9 + lVar11;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_._0_4_ = 1 << ((byte)lVar1 & 0x1f);
    if (lVar2 == 3) {
      gtest_ar_._0_4_ = 8;
    }
    testing::internal::CmpHelperEQ<aiPrimitiveType,unsigned_int>
              ((internal *)&gtest_ar,
               "((n+1) > 3 ? aiPrimitiveType_POLYGON : (aiPrimitiveType)(1u << ((n+1)-1)))",
               "mesh->mPrimitiveTypes",(aiPrimitiveType *)&gtest_ar_,&rhs->mPrimitiveTypes);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar8 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                 ,0xc0,pcVar8);
      testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar12 = rhs->mVertices != (aiVector3D *)0x0;
    gtest_ar_.success_ = bVar12;
    if (!bVar12) {
      testing::Message::Message((Message *)&AStack_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"NULL != mesh->mVertices","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                 ,0xc1,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&AStack_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&AStack_a8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = rhs->mNormals != (aiVector3D *)0x0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&AStack_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"NULL != mesh->mNormals","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                 ,0xc2,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&AStack_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&AStack_a8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = rhs->mTangents != (aiVector3D *)0x0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&AStack_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"NULL != mesh->mTangents","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                 ,0xc3,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&AStack_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&AStack_a8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = rhs->mBitangents != (aiVector3D *)0x0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&AStack_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"NULL != mesh->mBitangents","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                 ,0xc4,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&AStack_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&AStack_a8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = rhs->mTextureCoords[0] != (aiVector3D *)0x0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&AStack_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"NULL != mesh->mTextureCoords[0]","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                 ,0xc5,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&AStack_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&AStack_a8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = rhs->mNumFaces == uVar3;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&AStack_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"mesh->mNumFaces == idx","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                 ,199,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&AStack_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&AStack_a8);
    }
    lVar9 = lVar9 + lVar11 + 1;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    lVar11 = 0;
    for (uVar7 = 0; uVar7 < rhs->mNumFaces; uVar7 = uVar7 + 1) {
      uVar3 = *(uint *)((long)&rhs->mFaces->mNumIndices + lVar11);
      if (lVar1 - (ulong)uVar3 == -1) {
        gtest_ar_.success_ = true;
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      else {
        if (lVar2 == 3) {
          gtest_ar_.success_ = 3 < uVar3;
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (3 < uVar3) goto LAB_0038fe75;
        }
        else {
          gtest_ar_._0_4_ = (uint)(uint3)gtest_ar_._1_3_ << 8;
        }
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::Message::Message((Message *)&AStack_a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "face.mNumIndices == (n+1) || (3 == n && face.mNumIndices > 3)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                   ,0xca,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&AStack_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        std::__cxx11::string::~string((string *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&AStack_a8);
      }
LAB_0038fe75:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      lVar11 = lVar11 + 0x10;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

TEST_F(SortByPTypeProcessTest, SortByPTypeStep) {
    ScenePreprocessor s(mScene);
    s.ProcessScene();
    for (unsigned int m = 0; m< 10;++m)
        EXPECT_EQ(result[m], mScene->mMeshes[m]->mPrimitiveTypes);

    mProcess1->Execute(mScene);

    unsigned int idx = 0;
    for (unsigned int m = 0,real = 0; m< 10;++m) {
        for (unsigned int n = 0; n < 4;++n) {
            if ((idx = num[m][n])) {
                EXPECT_TRUE(real < mScene->mNumMeshes);

                aiMesh* mesh = mScene->mMeshes[real];

                EXPECT_TRUE(NULL != mesh);
                EXPECT_EQ(AI_PRIMITIVE_TYPE_FOR_N_INDICES(n+1), mesh->mPrimitiveTypes);
                EXPECT_TRUE(NULL != mesh->mVertices);
                EXPECT_TRUE(NULL != mesh->mNormals);
                EXPECT_TRUE(NULL != mesh->mTangents);
                EXPECT_TRUE(NULL != mesh->mBitangents);
                EXPECT_TRUE(NULL != mesh->mTextureCoords[0]);

                EXPECT_TRUE(mesh->mNumFaces == idx);
                for (unsigned int f = 0; f < mesh->mNumFaces;++f) {
                    aiFace& face = mesh->mFaces[f];
                    EXPECT_TRUE(face.mNumIndices == (n+1) || (3 == n && face.mNumIndices > 3));
                }
                ++real;
            }
        }
    }
}